

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O3

void __thiscall kj::parse::anon_unknown_0::TestCase362::run(TestCase362 *this)

{
  anon_union_16_1_a8c68091_for_NullableValue<kj::StringPtr>_2 *params_2;
  char *pcVar1;
  Input input;
  Maybe<kj::StringPtr> result;
  OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:365:17)>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:367:17)>_>
  parser;
  IteratorInput<char,_const_char_*> local_78;
  AddFailureAdapter local_58;
  Maybe<kj::StringPtr> local_40;
  undefined8 local_28 [2];
  
  local_28[0] = 0x72616200006f6f66;
  local_78.parent = (IteratorInput<char,_const_char_*> *)0x0;
  local_78.pos = "foo";
  local_78.end = "";
  local_78.best = "foo";
  OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,kj::parse::Exactly_<char>,kj::parse::Exactly_<char>>,kj::parse::(anonymous_namespace)::TestCase362::run()::$_0>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,kj::parse::Exactly_<char>,kj::parse::Exactly_<char>>,kj::parse::(anonymous_namespace)::TestCase362::run()::$_1>>
  ::operator()(&local_40,
               (OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,kj::parse::Exactly_<char>,kj::parse::Exactly_<char>>,kj::parse::(anonymous_namespace)::TestCase362::run()::__0>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,kj::parse::Exactly_<char>,kj::parse::Exactly_<char>>,kj::parse::(anonymous_namespace)::TestCase362::run()::__1>>
                *)local_28,&local_78);
  params_2 = &local_40.ptr.field_1;
  if (local_40.ptr.isSet == true) {
    if (((local_40.ptr.field_1.value.content.size_ != 4) ||
        ((char)*(short *)(local_40.ptr.field_1.value.content.ptr + 2) != 'o' ||
         *(short *)local_40.ptr.field_1.value.content.ptr != 0x6f66)) &&
       (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[33],char_const(&)[4],kj::StringPtr&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x176,ERROR,"\"failed: expected \" \"(\\\"foo\\\") == (*s)\", \"foo\", *s",
                 (char (*) [33])"failed: expected (\"foo\") == (*s)",(char (*) [4])0x38b288,
                 &params_2->value);
    }
  }
  else {
    local_58.file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
    ;
    local_58.line = 0x178;
    local_58.handled = true;
    kj::_::Debug::log<char_const(&)[19],char_const(&)[26]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
               ,0x178,ERROR,"\"expectation failed\", info",(char (*) [19])"expectation failed",
               (char (*) [26])"Expected \'foo\', got null.");
    AddFailureAdapter::~AddFailureAdapter(&local_58);
  }
  pcVar1 = local_78.pos;
  if ((local_78.pos != local_78.end) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[31]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
               ,0x17a,ERROR,"\"failed: expected \" \"input.atEnd()\"",
               (char (*) [31])"failed: expected input.atEnd()");
  }
  if (local_78.parent != (IteratorInput<char,_const_char_*> *)0x0) {
    if (local_78.best < pcVar1) {
      local_78.best = pcVar1;
    }
    if (local_78.best <= (local_78.parent)->best) {
      local_78.best = (local_78.parent)->best;
    }
    (local_78.parent)->best = local_78.best;
  }
  local_78.parent = (IteratorInput<char,_const_char_*> *)0x0;
  local_78.pos = "bar";
  local_78.end = "";
  local_78.best = "bar";
  OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,kj::parse::Exactly_<char>,kj::parse::Exactly_<char>>,kj::parse::(anonymous_namespace)::TestCase362::run()::$_0>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,kj::parse::Exactly_<char>,kj::parse::Exactly_<char>>,kj::parse::(anonymous_namespace)::TestCase362::run()::$_1>>
  ::operator()(&local_40,
               (OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,kj::parse::Exactly_<char>,kj::parse::Exactly_<char>>,kj::parse::(anonymous_namespace)::TestCase362::run()::__0>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,kj::parse::Exactly_<char>,kj::parse::Exactly_<char>>,kj::parse::(anonymous_namespace)::TestCase362::run()::__1>>
                *)local_28,&local_78);
  if (local_40.ptr.isSet == true) {
    if (((local_40.ptr.field_1.value.content.size_ != 4) ||
        ((char)*(short *)(local_40.ptr.field_1.value.content.ptr + 2) != 'r' ||
         *(short *)local_40.ptr.field_1.value.content.ptr != 0x6162)) &&
       (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[33],char_const(&)[4],kj::StringPtr&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x182,ERROR,"\"failed: expected \" \"(\\\"bar\\\") == (*s)\", \"bar\", *s",
                 (char (*) [33])"failed: expected (\"bar\") == (*s)",(char (*) [4])0x370438,
                 &params_2->value);
    }
  }
  else {
    local_58.file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
    ;
    local_58.line = 0x184;
    local_58.handled = true;
    kj::_::Debug::log<char_const(&)[19],char_const(&)[26]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
               ,0x184,ERROR,"\"expectation failed\", info",(char (*) [19])"expectation failed",
               (char (*) [26])"Expected \'bar\', got null.");
    AddFailureAdapter::~AddFailureAdapter(&local_58);
  }
  pcVar1 = local_78.pos;
  if ((local_78.pos != local_78.end) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[31]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
               ,0x186,ERROR,"\"failed: expected \" \"input.atEnd()\"",
               (char (*) [31])"failed: expected input.atEnd()");
  }
  if (local_78.parent != (IteratorInput<char,_const_char_*> *)0x0) {
    if (local_78.best < pcVar1) {
      local_78.best = pcVar1;
    }
    if (local_78.best <= (local_78.parent)->best) {
      local_78.best = (local_78.parent)->best;
    }
    (local_78.parent)->best = local_78.best;
  }
  return;
}

Assistant:

TEST(CommonParsers, OneOfParser) {
  auto parser = oneOf(
      transform(sequence(exactly('f'), exactly('o'), exactly('o')),
                []() -> StringPtr { return "foo"; }),
      transform(sequence(exactly('b'), exactly('a'), exactly('r')),
                []() -> StringPtr { return "bar"; }));

  {
    StringPtr text = "foo";
    Input input(text.begin(), text.end());
    Maybe<StringPtr> result = parser(input);
    KJ_IF_MAYBE(s, result) {
      EXPECT_EQ("foo", *s);
    } else {
      ADD_FAILURE() << "Expected 'foo', got null.";
    }
    EXPECT_TRUE(input.atEnd());
  }